

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglversionfunctionsfactory.cpp
# Opt level: O0

QAbstractOpenGLFunctions *
QOpenGLVersionFunctionsFactory::get(QOpenGLVersionProfile *versionProfile,QOpenGLContext *context)

{
  bool bVar1;
  OpenGLContextProfile OVar2;
  int iVar3;
  ulong uVar4;
  QAbstractOpenGLFunctions **ppQVar5;
  long lVar6;
  long in_RSI;
  long in_FS_OFFSET;
  QOpenGLVersionProfile *in_stack_00000008;
  QOpenGLContextVersionData *data;
  const_iterator it;
  QAbstractOpenGLFunctions *funcs;
  pair<int,_int> v;
  QOpenGLVersionProfile vp;
  QSurfaceFormat f;
  QOpenGLContext *in_stack_ffffffffffffff18;
  QAbstractOpenGLFunctions *in_stack_ffffffffffffff20;
  QSurfaceFormat *format;
  undefined1 in_stack_ffffffffffffff28 [16];
  long local_b8;
  QAbstractOpenGLFunctions *local_a8;
  QAbstractOpenGLFunctions *local_80;
  pair<int,_int> local_78;
  int local_70;
  int local_6c;
  pair<int,_int> local_68;
  QOpenGLVersionProfile local_60;
  QOpenGLVersionProfile local_58;
  undefined8 local_50;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = in_RSI;
  if (in_RSI == 0) {
    local_b8 = QOpenGLContext::currentContext();
  }
  if (local_b8 == 0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff28._8_8_,in_stack_ffffffffffffff28._0_8_,
               (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(char *)in_stack_ffffffffffffff18);
    QMessageLogger::warning(local_28,"versionFunctions: No OpenGL context");
    local_a8 = (QAbstractOpenGLFunctions *)0x0;
  }
  else {
    uVar4 = QOpenGLContext::isOpenGLES();
    if ((uVar4 & 1) == 0) {
      local_50 = 0xaaaaaaaaaaaaaaaa;
      QOpenGLContext::format();
      local_58.d = (QOpenGLVersionProfilePrivate *)0xaaaaaaaaaaaaaaaa;
      QOpenGLVersionProfile::QOpenGLVersionProfile
                (in_stack_ffffffffffffff28._8_8_,in_stack_ffffffffffffff28._0_8_);
      bVar1 = QOpenGLVersionProfile::isValid(&local_58);
      format = in_stack_ffffffffffffff28._0_8_;
      if (!bVar1) {
        QOpenGLVersionProfile::QOpenGLVersionProfile(in_stack_ffffffffffffff28._8_8_,format);
        QOpenGLVersionProfile::operator=(&local_58,&local_60);
        QOpenGLVersionProfile::~QOpenGLVersionProfile
                  ((QOpenGLVersionProfile *)in_stack_ffffffffffffff20);
      }
      local_68.first = -0x55555556;
      local_68.second = -0x55555556;
      local_6c = QSurfaceFormat::majorVersion();
      local_70 = QSurfaceFormat::minorVersion();
      std::pair<int,_int>::pair<int,_int,_true>(&local_68,&local_6c,&local_70);
      local_78 = QOpenGLVersionProfile::version((QOpenGLVersionProfile *)in_stack_ffffffffffffff20);
      bVar1 = std::operator<(&local_68,&local_78);
      if (bVar1) {
        local_a8 = (QAbstractOpenGLFunctions *)0x0;
      }
      else {
        bVar1 = QOpenGLVersionProfile::hasProfiles(&local_58);
        if ((((bVar1) && (OVar2 = QOpenGLVersionProfile::profile(&local_58), OVar2 != CoreProfile))
            || (bVar1 = QOpenGLVersionProfile::isLegacyVersion(&local_58), bVar1)) &&
           (iVar3 = QSurfaceFormat::profile(), iVar3 == 1)) {
          local_a8 = (QAbstractOpenGLFunctions *)0x0;
        }
        else {
          QOpenGLContextVersionData::forContext((QOpenGLContext *)in_stack_ffffffffffffff20);
          QHash<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*>::constFind
                    ((QHash<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*> *)
                     in_stack_ffffffffffffff20,(QOpenGLVersionProfile *)in_stack_ffffffffffffff18);
          QHash<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*>::constEnd
                    ((QHash<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*> *)format);
          bVar1 = QHash<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*>::const_iterator::
                  operator==((const_iterator *)format,(const_iterator *)in_stack_ffffffffffffff20);
          if (bVar1) {
            local_80 = createFunctions(in_stack_00000008);
            if (local_80 != (QAbstractOpenGLFunctions *)0x0) {
              QAbstractOpenGLFunctions::setOwningContext
                        (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
              QHash<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*>::insert
                        ((QHash<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*> *)
                         in_stack_ffffffffffffff20,
                         (QOpenGLVersionProfile *)in_stack_ffffffffffffff18,
                         (QAbstractOpenGLFunctions **)0x1b13f7);
            }
          }
          else {
            ppQVar5 = QHash<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*>::const_iterator::
                      value((const_iterator *)0x1b140d);
            local_80 = *ppQVar5;
          }
          if ((local_80 != (QAbstractOpenGLFunctions *)0x0) &&
             (lVar6 = QOpenGLContext::currentContext(), lVar6 == local_b8)) {
            (*local_80->_vptr_QAbstractOpenGLFunctions[2])();
          }
          local_a8 = local_80;
        }
      }
      QOpenGLVersionProfile::~QOpenGLVersionProfile
                ((QOpenGLVersionProfile *)in_stack_ffffffffffffff20);
      QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_50);
    }
    else {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff28._8_8_,in_stack_ffffffffffffff28._0_8_,
                 (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(char *)in_stack_ffffffffffffff18);
      QMessageLogger::warning(local_48,"versionFunctions: Not supported on OpenGL ES");
      local_a8 = (QAbstractOpenGLFunctions *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a8;
}

Assistant:

QAbstractOpenGLFunctions *QOpenGLVersionFunctionsFactory::get(const QOpenGLVersionProfile &versionProfile, QOpenGLContext *context)
{
    if (!context)
        context = QOpenGLContext::currentContext();

    if (!context) {
        qWarning("versionFunctions: No OpenGL context");
        return nullptr;
    }

#if !QT_CONFIG(opengles2)
    if (context->isOpenGLES()) {
        qWarning("versionFunctions: Not supported on OpenGL ES");
        return nullptr;
    }
#endif // !QT_CONFIG(opengles2)

    const QSurfaceFormat f = context->format();

    // Ensure we have a valid version and profile. Default to context's if none specified
    QOpenGLVersionProfile vp = versionProfile;
    if (!vp.isValid())
        vp = QOpenGLVersionProfile(f);

    // Check that context is compatible with requested version
    const auto v = std::pair(f.majorVersion(), f.minorVersion());
    if (v < vp.version())
        return nullptr;

    // If this context only offers core profile functions then we can't create
    // function objects for legacy or compatibility profile requests
    if (((vp.hasProfiles() && vp.profile() != QSurfaceFormat::CoreProfile) || vp.isLegacyVersion())
        && f.profile() == QSurfaceFormat::CoreProfile)
        return nullptr;

    // Create object if suitable one not cached
    QAbstractOpenGLFunctions* funcs = nullptr;
    // TODO: replace with something else
    auto *data = QOpenGLContextVersionData::forContext(context);
    auto it = data->functions.constFind(vp);
    if (it == data->functions.constEnd()) {
        funcs = createFunctions(vp);
        if (funcs) {
            funcs->setOwningContext(context);
            data->functions.insert(vp, funcs);
        }
    } else {
        funcs = it.value();
    }

    if (funcs && QOpenGLContext::currentContext() == context)
        funcs->initializeOpenGLFunctions();

    return funcs;
}